

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O3

int schemasTest(char *filename,char *resul,char *errr,int options)

{
  bool bVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  undefined8 uVar8;
  long lVar9;
  size_t sVar10;
  char *pcVar11;
  void *pvVar12;
  void *ctx;
  ulong uVar13;
  long lVar14;
  glob_t globbuf;
  char prefix [500];
  char err [500];
  char pattern [500];
  int local_6a8;
  glob64_t local_670;
  undefined1 local_628 [512];
  char local_428 [499];
  undefined1 local_235;
  char local_228 [499];
  undefined1 local_35;
  
  pcVar7 = baseFilename(filename);
  uVar8 = xmlSchemaNewParserCtxt(filename);
  xmlSchemaSetParserStructuredErrors(uVar8,testStructuredErrorHandler,0);
  lVar9 = xmlSchemaParse(uVar8);
  xmlSchemaFreeParserCtxt(uVar8);
  iVar2 = testErrorsSize;
  sVar10 = strlen(pcVar7);
  iVar4 = (int)sVar10;
  if (iVar4 - 500U < 0xfffffe11) {
    xmlSchemaFree(lVar9);
    iVar4 = -1;
  }
  else {
    iVar5 = iVar4 + -6;
    if (pcVar7[(long)iVar4 + -6] != '_') {
      iVar5 = iVar4 + -4;
    }
    if (pcVar7[(long)iVar5 + -2] == '_') {
      iVar5 = iVar5 + -2;
    }
    sVar10 = (size_t)iVar5;
    memcpy(local_628,pcVar7,sVar10);
    local_628[sVar10] = 0;
    iVar4 = snprintf(local_228,499,"./test/schemas/%s_*.xml",local_628);
    if (0x1f2 < iVar4) {
      local_35 = 0;
    }
    if (pcVar7[sVar10] == '_') {
      memcpy(local_628,pcVar7,sVar10 + 2);
      local_628[sVar10 + 2] = 0;
    }
    local_670.gl_offs = 0;
    iVar4 = 0;
    glob64(local_228,8,(__errfunc *)0x0,&local_670);
    if (local_670.gl_pathc != 0) {
      uVar13 = 0;
      iVar4 = 0;
      do {
        testErrorsSize = iVar2;
        testErrors[iVar2] = '\0';
        pcVar7 = local_670.gl_pathv[uVar13];
        pcVar11 = baseFilename(pcVar7);
        sVar10 = strlen(pcVar11);
        iVar5 = (int)sVar10;
        if ((iVar5 < 7) || (pcVar11[iVar5 - 6] != '_')) {
          fprintf(_stderr,"don\'t know how to process %s\n",pcVar7);
        }
        else {
          iVar6 = snprintf(local_428,499,"result/schemas/%s_%c.err",local_628,
                           (ulong)(uint)(int)pcVar11[iVar5 - 5]);
          iVar5 = testErrorsSize;
          if (0x1f2 < iVar6) {
            local_235 = 0;
          }
          nb_tests = nb_tests + 1;
          lVar14 = (long)testErrorsSize;
          local_6a8 = 0;
          bVar3 = true;
          do {
            bVar1 = bVar3;
            testErrorsSize = iVar5;
            testErrors[lVar14] = '\0';
            iVar6 = iVar5;
            if (lVar9 != 0) {
              pvVar12 = (void *)xmlSchemaNewValidCtxt(lVar9);
              xmlSchemaSetValidStructuredErrors(pvVar12,testStructuredErrorHandler,0);
              if (bVar1) {
                ctx = (void *)xmlReadFile(pcVar7,0,options);
                if (ctx == (void *)0x0) {
                  fprintf(_stderr,"failed to parse instance %s for %s\n",pcVar7,filename);
                  iVar4 = -1;
                  goto LAB_0010aabe;
                }
                iVar6 = xmlSchemaValidateDoc(pvVar12,ctx);
                xmlFreeDoc();
              }
              else {
                ctx = pvVar12;
                iVar6 = xmlSchemaValidateFile(pvVar12,pcVar7,options);
              }
              pcVar11 = "%s validation generated an internal error\n";
              if (0 < iVar6) {
                pcVar11 = "%s fails to validate\n";
              }
              if (iVar6 == 0) {
                pcVar11 = "%s validates\n";
              }
              testErrorHandler(ctx,pcVar11,pcVar7);
              xmlSchemaFreeValidCtxt(pvVar12);
              iVar6 = testErrorsSize;
            }
            iVar6 = compareFileMem(local_428,testErrors,iVar6);
            if (iVar6 != 0) {
              fprintf(_stderr,"Error for %s on %s failed\n",pcVar7,filename);
              local_6a8 = 1;
            }
            bVar3 = false;
          } while (bVar1);
          if (local_6a8 != 0) {
            iVar4 = local_6a8;
          }
        }
LAB_0010aabe:
        uVar13 = uVar13 + 1;
      } while (uVar13 < local_670.gl_pathc);
    }
    globfree64(&local_670);
    xmlSchemaFree(lVar9);
  }
  return iVar4;
}

Assistant:

static int
schemasTest(const char *filename,
            const char *resul ATTRIBUTE_UNUSED,
            const char *errr ATTRIBUTE_UNUSED,
            int options) {
    const char *base = baseFilename(filename);
    const char *base2;
    const char *instance;
    xmlSchemaParserCtxtPtr ctxt;
    xmlSchemaPtr schemas;
    int res = 0, len, ret;
    int parseErrorsSize;
    char pattern[500];
    char prefix[500];
    char err[500];
    glob_t globbuf;
    size_t i;
    char count = 0;

    /* first compile the schemas if possible */
    ctxt = xmlSchemaNewParserCtxt(filename);
    xmlSchemaSetParserStructuredErrors(ctxt, testStructuredErrorHandler, NULL);
    schemas = xmlSchemaParse(ctxt);
    xmlSchemaFreeParserCtxt(ctxt);
    parseErrorsSize = testErrorsSize;

    /*
     * most of the mess is about the output filenames generated by the Makefile
     */
    len = strlen(base);
    if ((len > 499) || (len < 5)) {
        xmlSchemaFree(schemas);
	return(-1);
    }
    len -= 4; /* remove trailing .xsd */
    if (base[len - 2] == '_') {
        len -= 2; /* remove subtest number */
    }
    if (base[len - 2] == '_') {
        len -= 2; /* remove subtest number */
    }
    memcpy(prefix, base, len);
    prefix[len] = 0;

    if (snprintf(pattern, 499, "./test/schemas/%s_*.xml", prefix) >= 499)
        pattern[499] = 0;

    if (base[len] == '_') {
        len += 2;
	memcpy(prefix, base, len);
	prefix[len] = 0;
    }

    globbuf.gl_offs = 0;
    glob(pattern, GLOB_DOOFFS, NULL, &globbuf);
    for (i = 0;i < globbuf.gl_pathc;i++) {
        testErrorsSize = parseErrorsSize;
        testErrors[parseErrorsSize] = 0;
        instance = globbuf.gl_pathv[i];
	base2 = baseFilename(instance);
	len = strlen(base2);
	if ((len > 6) && (base2[len - 6] == '_')) {
	    count = base2[len - 5];
	    ret = snprintf(err, 499, "result/schemas/%s_%c.err",
		     prefix, count);
            if (ret >= 499)
	        err[499] = 0;
	} else {
	    fprintf(stderr, "don't know how to process %s\n", instance);
	    continue;
	}

        nb_tests++;
        ret = schemasOneTest(filename, instance, err, options, schemas);
        if (ret != 0)
            res = ret;
    }
    globfree(&globbuf);
    xmlSchemaFree(schemas);

    return(res);
}